

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# write_sf2.cpp
# Opt level: O1

int main(int argc,char **argv)

{
  _Atomic_word *p_Var1;
  SFModulatorItem modulator;
  element_type *args_1;
  int iVar2;
  void *__s;
  value_type_conflict1 *__val;
  long lVar3;
  initializer_list<sf2cute::SFGeneratorItem> __l;
  initializer_list<sf2cute::SFInstrumentZone> __l_00;
  initializer_list<sf2cute::SFPresetZone> __l_01;
  vector<short,_std::allocator<short>_> data_50;
  shared_ptr<sf2cute::SFInstrument> instrument_50;
  shared_ptr<sf2cute::SFSample> sample_50;
  shared_ptr<sf2cute::SFPreset> preset_50;
  SFInstrumentZone instrument_zone;
  ofstream ofs;
  SoundFont sf2;
  allocator_type local_539;
  undefined8 local_538;
  undefined8 local_530;
  undefined1 local_524 [8];
  SFGeneratorItem local_51c;
  void *local_518;
  void *pvStack_510;
  long local_508;
  vector<sf2cute::SFInstrumentZone,_std::allocator<sf2cute::SFInstrumentZone>_> local_4f8;
  undefined1 local_4e0 [24];
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_4c8;
  weak_ptr<sf2cute::SFInstrument> local_4c0;
  undefined1 local_4b0 [24];
  _Alloc_hider local_498;
  vector<sf2cute::SFGeneratorItem,_std::allocator<sf2cute::SFGeneratorItem>_> local_490;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_478;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  aStack_468;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  aStack_458;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  aStack_448;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  aStack_438;
  undefined1 local_428 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_418;
  undefined1 local_408 [24];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_3f0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_3e0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_3d0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_3c0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_3b0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_3a0;
  undefined1 local_390 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  aStack_380;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  aStack_370;
  _Alloc_hider _Stack_360;
  element_type *local_358;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_350 [11];
  ios_base local_298 [264];
  undefined1 local_190 [104];
  string local_128 [32];
  string local_108 [232];
  
  sf2cute::SoundFont::SoundFont((SoundFont *)local_190);
  local_3b0._M_allocated_capacity = (size_type)&local_3a0;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_3b0,"EMU8000","");
  std::__cxx11::string::operator=((string *)(local_190 + 0x48),(string *)local_3b0._M_local_buf);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_3b0._M_allocated_capacity != &local_3a0) {
    operator_delete((void *)local_3b0._M_allocated_capacity,local_3a0._M_allocated_capacity + 1);
  }
  local_3d0._M_allocated_capacity = (size_type)&local_3c0;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_3d0,"Chipsound","");
  std::__cxx11::string::operator=(local_128,(string *)local_3d0._M_local_buf);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_3d0._M_allocated_capacity != &local_3c0) {
    operator_delete((void *)local_3d0._M_allocated_capacity,local_3c0._M_allocated_capacity + 1);
  }
  local_3f0._M_allocated_capacity = (size_type)&local_3e0;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_3f0,"ROM","");
  std::__cxx11::string::operator=(local_108,(string *)local_3f0._M_local_buf);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_3f0._M_allocated_capacity != &local_3e0) {
    operator_delete((void *)local_3f0._M_allocated_capacity,local_3e0._M_allocated_capacity + 1);
  }
  local_518 = (void *)0x0;
  pvStack_510 = (void *)0x0;
  local_508 = 0;
  __s = operator_new(400);
  lVar3 = 0;
  local_518 = __s;
  pvStack_510 = __s;
  local_508 = (long)__s + 400;
  memset(__s,0,400);
  do {
    *(undefined2 *)((long)__s + lVar3) = 0x4000;
    lVar3 = lVar3 + 2;
  } while (lVar3 != 200);
  pvStack_510 = (void *)((long)__s + 400);
  memset((void *)((long)__s + 200),0,200);
  local_390._0_8_ = (ulong)(uint)local_390._4_4_ << 0x20;
  local_478._M_allocated_capacity._0_4_ = 200;
  local_4f8.
  super__Vector_base<sf2cute::SFInstrumentZone,_std::allocator<sf2cute::SFInstrumentZone>_>._M_impl.
  super__Vector_impl_data._M_start._0_4_ = 0xac44;
  local_4e0._0_4_ = 0x39;
  local_4b0._0_4_ = 0;
  sf2cute::SoundFont::
  NewSample<char_const(&)[7],std::vector<short,std::allocator<short>>&,int,unsigned_int,int,int,int>
            ((SoundFont *)(local_4e0 + 0x10),(char (*) [7])local_190,
             (vector<short,_std::allocator<short>_> *)"Square",(int *)&local_518,(uint *)local_390,
             (int *)local_478._M_local_buf,(int *)&local_4f8,(int *)local_4e0);
  local_4b0._16_8_ = local_4e0._16_8_;
  local_498._M_p = (pointer)local_4c8;
  if (local_4c8 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      local_4c8->_M_weak_count = local_4c8->_M_weak_count + 1;
      UNLOCK();
    }
    else {
      local_4c8->_M_weak_count = local_4c8->_M_weak_count + 1;
    }
  }
  sf2cute::SFGeneratorItem::SFGeneratorItem
            ((SFGeneratorItem *)local_390,kSampleModes,(GenAmountType)0x1);
  __l._M_len = 1;
  __l._M_array = (iterator)local_390;
  std::vector<sf2cute::SFGeneratorItem,_std::allocator<sf2cute::SFGeneratorItem>_>::vector
            (&local_490,__l,(allocator_type *)&local_4f8);
  local_428._0_8_ = (pointer)0x0;
  local_428._8_8_ = (pointer)0x0;
  local_418._0_8_ = (pointer)0x0;
  sf2cute::SFInstrumentZone::SFInstrumentZone
            ((SFInstrumentZone *)&local_478,(weak_ptr<sf2cute::SFSample> *)(local_4b0 + 0x10),
             &local_490,
             (vector<sf2cute::SFModulatorItem,_std::allocator<sf2cute::SFModulatorItem>_> *)
             local_428);
  if ((pointer)local_428._0_8_ != (pointer)0x0) {
    operator_delete((void *)local_428._0_8_,local_418._0_8_ - local_428._0_8_);
  }
  if (local_490.
      super__Vector_base<sf2cute::SFGeneratorItem,_std::allocator<sf2cute::SFGeneratorItem>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_490.
                    super__Vector_base<sf2cute::SFGeneratorItem,_std::allocator<sf2cute::SFGeneratorItem>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_490.
                          super__Vector_base<sf2cute::SFGeneratorItem,_std::allocator<sf2cute::SFGeneratorItem>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_490.
                          super__Vector_base<sf2cute::SFGeneratorItem,_std::allocator<sf2cute::SFGeneratorItem>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_498._M_p !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      p_Var1 = (_Atomic_word *)(local_498._M_p + 0xc);
      iVar2 = *p_Var1;
      *p_Var1 = *p_Var1 + -1;
      UNLOCK();
    }
    else {
      iVar2 = *(int *)(local_498._M_p + 0xc);
      *(int *)(local_498._M_p + 0xc) = iVar2 + -1;
    }
    if (iVar2 == 1) {
      (**(code **)(*(long *)local_498._M_p + 0x18))();
    }
  }
  sf2cute::SFGeneratorItem::SFGeneratorItem(&local_51c,kReverbEffectsSend,(GenAmountType)0x26a);
  sf2cute::SFZone::SetGenerator((SFZone *)&local_478,local_51c);
  sf2cute::SFModulator::SFModulator
            ((SFModulator *)&local_530,kNoteOnVelocity,kDecrease,kUnipolar,kConcave);
  sf2cute::SFModulator::SFModulator((SFModulator *)&local_538,0);
  sf2cute::SFModulatorItem::SFModulatorItem
            ((SFModulatorItem *)local_408,
             (SFModulator)((uint5)local_530._4_4_ << 0x20 | (uint5)(uint)local_530),
             kInitialAttenuation,0x3c0,
             (SFModulator)((uint5)local_538._4_4_ << 0x20 | (uint5)(uint)local_538),kLinear);
  modulator.key_.amount_source_op_.controller_ = local_408[8];
  modulator.key_.amount_source_op_.controller_palette_ = local_408[9];
  modulator.key_.amount_source_op_.direction_ = local_408[10];
  modulator.key_.amount_source_op_.polarity_ = local_408[0xb];
  modulator.key_.amount_source_op_.type_ = local_408[0xc];
  modulator.key_._13_1_ = local_408[0xd];
  modulator.amount_ = local_408._14_2_;
  modulator.key_.source_op_.controller_ = local_408[0];
  modulator.key_.source_op_.controller_palette_ = local_408[1];
  modulator.key_.source_op_.direction_ = local_408[2];
  modulator.key_.source_op_.polarity_ = local_408[3];
  modulator.key_.source_op_.type_ = local_408[4];
  modulator.key_._5_1_ = local_408[5];
  modulator.key_.destination_op_ = local_408._6_2_;
  modulator._16_2_ = local_408._16_2_;
  sf2cute::SFZone::SetModulator((SFZone *)&local_478,modulator);
  local_390._8_8_ = local_478._8_8_;
  aStack_380._M_allocated_capacity = aStack_468._M_allocated_capacity;
  aStack_380._8_8_ = aStack_468._8_8_;
  aStack_370._M_allocated_capacity = aStack_458._M_allocated_capacity;
  local_478._8_8_ = 0;
  aStack_468._M_allocated_capacity = 0;
  aStack_468._8_8_ = 0;
  aStack_370._8_8_ = aStack_458._8_8_;
  _Stack_360._M_p = (pointer)aStack_448._M_allocated_capacity;
  aStack_458._M_allocated_capacity = 0;
  aStack_458._8_8_ = 0;
  aStack_448._M_allocated_capacity = 0;
  local_390._0_8_ = &PTR__SFInstrumentZone_0011e790;
  local_358 = (element_type *)aStack_448._8_8_;
  local_350[0]._M_allocated_capacity = aStack_438._M_allocated_capacity;
  aStack_448._8_8_ = 0;
  aStack_438._M_allocated_capacity = 0;
  local_350[0]._8_8_ = aStack_438._8_8_;
  __l_00._M_len = 1;
  __l_00._M_array = (iterator)local_390;
  std::vector<sf2cute::SFInstrumentZone,_std::allocator<sf2cute::SFInstrumentZone>_>::vector
            (&local_4f8,__l_00,(allocator_type *)local_4b0);
  sf2cute::SoundFont::
  NewInstrument<std::__cxx11::string_const&,std::vector<sf2cute::SFInstrumentZone,std::allocator<sf2cute::SFInstrumentZone>>>
            ((SoundFont *)local_4e0,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_190,
             (vector<sf2cute::SFInstrumentZone,_std::allocator<sf2cute::SFInstrumentZone>_> *)
             local_4e0._16_8_);
  std::vector<sf2cute::SFInstrumentZone,_std::allocator<sf2cute::SFInstrumentZone>_>::~vector
            (&local_4f8);
  sf2cute::SFInstrumentZone::~SFInstrumentZone((SFInstrumentZone *)local_390);
  args_1 = (element_type *)CONCAT44(local_4e0._4_4_,local_4e0._0_4_);
  local_524._4_4_ = 0;
  local_524._0_4_ = 0;
  local_4c0.super___weak_ptr<sf2cute::SFInstrument,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_4e0._8_8_;
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_4e0._8_8_ !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      *(_Atomic_word *)(local_4e0._8_8_ + 0xc) = *(_Atomic_word *)(local_4e0._8_8_ + 0xc) + 1;
      UNLOCK();
    }
    else {
      *(_Atomic_word *)(local_4e0._8_8_ + 0xc) = *(_Atomic_word *)(local_4e0._8_8_ + 0xc) + 1;
    }
  }
  local_4c0.super___weak_ptr<sf2cute::SFInstrument,_(__gnu_cxx::_Lock_policy)2>._M_ptr = args_1;
  sf2cute::SFPresetZone::SFPresetZone((SFPresetZone *)local_390,&local_4c0);
  __l_01._M_len = 1;
  __l_01._M_array = (iterator)local_390;
  std::vector<sf2cute::SFPresetZone,_std::allocator<sf2cute::SFPresetZone>_>::vector
            ((vector<sf2cute::SFPresetZone,_std::allocator<sf2cute::SFPresetZone>_> *)&local_4f8,
             __l_01,&local_539);
  sf2cute::SoundFont::
  NewPreset<std::__cxx11::string_const&,int,int,std::vector<sf2cute::SFPresetZone,std::allocator<sf2cute::SFPresetZone>>>
            ((SoundFont *)local_4b0,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_190,
             (int *)args_1,(int *)(local_524 + 4),
             (vector<sf2cute::SFPresetZone,_std::allocator<sf2cute::SFPresetZone>_> *)local_524);
  std::vector<sf2cute::SFPresetZone,_std::allocator<sf2cute::SFPresetZone>_>::~vector
            ((vector<sf2cute::SFPresetZone,_std::allocator<sf2cute::SFPresetZone>_> *)&local_4f8);
  sf2cute::SFPresetZone::~SFPresetZone((SFPresetZone *)local_390);
  if (local_4c0.super___weak_ptr<sf2cute::SFInstrument,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      p_Var1 = &(local_4c0.super___weak_ptr<sf2cute::SFInstrument,_(__gnu_cxx::_Lock_policy)2>.
                 _M_refcount._M_pi)->_M_weak_count;
      iVar2 = *p_Var1;
      *p_Var1 = *p_Var1 + -1;
      UNLOCK();
    }
    else {
      iVar2 = (local_4c0.super___weak_ptr<sf2cute::SFInstrument,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi)->_M_weak_count;
      (local_4c0.super___weak_ptr<sf2cute::SFInstrument,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi)->_M_weak_count = iVar2 + -1;
    }
    if (iVar2 == 1) {
      (*(local_4c0.super___weak_ptr<sf2cute::SFInstrument,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
        _M_pi)->_vptr__Sp_counted_base[3])();
    }
  }
  std::ofstream::ofstream(local_390,"output.sf2",_S_bin);
  sf2cute::SoundFont::Write((SoundFont *)local_190,(ostream *)local_390);
  local_390._0_8_ = _VTT;
  *(undefined8 *)(local_390 + (long)_VTT[-3]) = __filebuf;
  std::filebuf::~filebuf((filebuf *)(local_390 + 8));
  std::ios_base::~ios_base(local_298);
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_4b0._8_8_ !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_4b0._8_8_);
  }
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_4e0._8_8_ !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_4e0._8_8_);
  }
  sf2cute::SFInstrumentZone::~SFInstrumentZone((SFInstrumentZone *)&local_478);
  if (local_4c8 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_4c8);
  }
  if (local_518 != (void *)0x0) {
    operator_delete(local_518,local_508 - (long)local_518);
  }
  sf2cute::SoundFont::~SoundFont((SoundFont *)local_190);
  return 0;
}

Assistant:

int main(int argc, char * argv[]) {
  SoundFont sf2;

  // Set metadata.
  sf2.set_sound_engine("EMU8000");
  sf2.set_bank_name("Chipsound");
  sf2.set_rom_name("ROM");

  // Construct sample datapoints.
  std::vector<int16_t> data_50 = MakePulseVector(4);

  // Add a sample.
  std::shared_ptr<SFSample> sample_50 = sf2.NewSample(
    "Square",                 // name
    data_50,                  // sample data
    0,                        // start loop
    uint32_t(data_50.size()), // end loop
    44100,                    // sample rate
    57,                       // root key
    0);                       // microtuning

  // Make an instrument zone.
  SFInstrumentZone instrument_zone(sample_50,
    std::vector<SFGeneratorItem>{
      //SFGeneratorItem(SFGenerator::kKeyRange, RangesType(0, 127)),
      //SFGeneratorItem(SFGenerator::kVelRange, RangesType(0, 127)),
      SFGeneratorItem(SFGenerator::kSampleModes, uint16_t(SampleMode::kLoopContinuously)),
    },
    std::vector<SFModulatorItem>{});
  // Add more generators or modulators if necessary.
  instrument_zone.SetGenerator(SFGeneratorItem(SFGenerator::kReverbEffectsSend, 618));
  instrument_zone.SetModulator(SFModulatorItem(
      SFModulator(SFGeneralController::kNoteOnVelocity,
      SFControllerDirection::kDecrease, SFControllerPolarity::kUnipolar,
      SFControllerType::kConcave),
    SFGenerator::kInitialAttenuation,
    960,
    SFModulator(0),
    SFTransform::kLinear));

  // Add an instrument.
  std::shared_ptr<SFInstrument> instrument_50 = sf2.NewInstrument(
    sample_50->name(),
    std::vector<SFInstrumentZone>{
      std::move(instrument_zone)
    });

  // Add a preset.
  std::shared_ptr<SFPreset> preset_50 = sf2.NewPreset(
    instrument_50->name(), 0, 0,
    std::vector<SFPresetZone>{
      SFPresetZone(instrument_50)
    });

  // Print the tree for debugging.
#ifdef SF2CUTE_EXAMPLES_DEBUG_HPP_
  PrintSoundFont(sf2);
#endif

  // Write SoundFont file.
  try {
    std::ofstream ofs("output.sf2", std::ios::binary);
    sf2.Write(ofs);
    return 0;
  }
  catch (const std::fstream::failure & e) {
    // File output error.
    std::cerr << e.what() << std::endl;
    return 1;
  }
  catch (const std::exception & e) {
    // Other errors.
    // For example: Too many samples.
    std::cerr << e.what() << std::endl;
    return 1;
  }
}